

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.h
# Opt level: O3

void * Js::JavascriptOperators::JitRecyclerAlloc<Js::SparseArraySegmentBase>
                 (size_t size,Recycler *recycler)

{
  char *pcVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)(size - 0x18);
  local_40 = (undefined1  [8])&SparseArraySegmentBase::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_1a248d8;
  data.filename._0_4_ = 0x295;
  Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_40);
  pcVar1 = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                     (recycler,size);
  return pcVar1;
}

Assistant:

static void * JitRecyclerAlloc(DECLSPEC_GUARD_OVERFLOW size_t size, Recycler* recycler)
        {
            TRACK_ALLOC_INFO(recycler, T, Recycler, size - sizeof(T), (size_t)-1);
            return recycler->AllocZero(size);
        }